

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring64_bitmap_t * roaring64_bitmap_portable_deserialize_safe(char *buf,size_t maxbytes)

{
  ushort uVar1;
  uint high_bits;
  ulong uVar2;
  bool bVar3;
  roaring64_bitmap_t *dst;
  size_t sVar4;
  roaring_bitmap_t *src;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint *puVar10;
  
  if ((maxbytes < 8 || buf == (char *)0x0) || (uVar2 = *(ulong *)buf, uVar2 >> 0x20 != 0)) {
LAB_0011e977:
    dst = (roaring64_bitmap_t *)0x0;
  }
  else {
    puVar10 = (uint *)(buf + 8);
    lVar9 = 8;
    dst = roaring64_bitmap_create();
    uVar5 = 0xffffffffffffffff;
    for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
      uVar8 = lVar9 + 4;
      if (maxbytes < uVar8) {
LAB_0011e96f:
        roaring64_bitmap_free(dst);
        goto LAB_0011e977;
      }
      high_bits = *puVar10;
      if ((long)(ulong)high_bits <= (long)uVar5) goto LAB_0011e96f;
      puVar10 = puVar10 + 1;
      sVar4 = ra_portable_deserialize_size((char *)puVar10,maxbytes - uVar8);
      if (sVar4 == 0) goto LAB_0011e96f;
      src = roaring_bitmap_portable_deserialize_safe((char *)puVar10,maxbytes - uVar8);
      if (src == (roaring_bitmap_t *)0x0) goto LAB_0011e96f;
      puVar10 = (uint *)((long)puVar10 + sVar4);
      lVar9 = uVar8 + sVar4;
      uVar7 = (src->high_low_container).size;
      uVar5 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar5 = 0;
      }
      uVar8 = 0;
      uVar7 = 0xffffffff;
      while (uVar5 != uVar8) {
        uVar1 = (src->high_low_container).keys[uVar8];
        uVar8 = uVar8 + 1;
        bVar3 = (int)(uint)uVar1 <= (int)uVar7;
        uVar7 = (uint)uVar1;
        if (bVar3) {
          roaring_bitmap_free(src);
          goto LAB_0011e96f;
        }
      }
      move_from_roaring32_offset(dst,src,high_bits);
      roaring_bitmap_free(src);
      uVar5 = (ulong)high_bits;
    }
  }
  return dst;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_portable_deserialize_safe(
    const char *buf, size_t maxbytes) {
    // https://github.com/RoaringBitmap/RoaringFormatSpec#extension-for-64-bit-implementations
    if (buf == NULL) {
        return NULL;
    }
    size_t read_bytes = 0;

    // Read as uint64 the distinct number of "buckets", where a bucket is
    // defined as the most significant 32 bits of an element.
    uint64_t buckets;
    if (read_bytes + sizeof(buckets) > maxbytes) {
        return NULL;
    }
    memcpy(&buckets, buf, sizeof(buckets));
    buf += sizeof(buckets);
    read_bytes += sizeof(buckets);

    // Buckets should be 32 bits with 4 bits of zero padding.
    if (buckets > UINT32_MAX) {
        return NULL;
    }

    roaring64_bitmap_t *r = roaring64_bitmap_create();
    // Iterate through buckets ordered by increasing keys.
    int64_t previous_high32 = -1;
    for (uint64_t bucket = 0; bucket < buckets; ++bucket) {
        // Read as uint32 the most significant 32 bits of the bucket.
        uint32_t high32;
        if (read_bytes + sizeof(high32) > maxbytes) {
            roaring64_bitmap_free(r);
            return NULL;
        }
        memcpy(&high32, buf, sizeof(high32));
        buf += sizeof(high32);
        read_bytes += sizeof(high32);
        // High 32 bits must be strictly increasing.
        if (high32 <= previous_high32) {
            roaring64_bitmap_free(r);
            return NULL;
        }
        previous_high32 = high32;

        // Read the 32-bit Roaring bitmaps representing the least
        // significant bits of a set of elements.
        size_t bitmap32_size = roaring_bitmap_portable_deserialize_size(
            buf, maxbytes - read_bytes);
        if (bitmap32_size == 0) {
            roaring64_bitmap_free(r);
            return NULL;
        }

        roaring_bitmap_t *bitmap32 = roaring_bitmap_portable_deserialize_safe(
            buf, maxbytes - read_bytes);
        if (bitmap32 == NULL) {
            roaring64_bitmap_free(r);
            return NULL;
        }
        buf += bitmap32_size;
        read_bytes += bitmap32_size;

        // While we don't attempt to validate much, we must ensure that there
        // is no duplication in the high 48 bits - inserting into the ART
        // assumes (or UB) no duplicate keys. The top 32 bits must be unique
        // because we check for strict increasing values of  high32, but we
        // must also ensure the top 16 bits within each 32-bit bitmap are also
        // at least unique (we ensure they're strictly increasing as well,
        // which they must be for a _valid_ bitmap, since it's cheaper to check)
        int32_t last_bitmap_key = -1;
        for (int i = 0; i < bitmap32->high_low_container.size; i++) {
            uint16_t key = bitmap32->high_low_container.keys[i];
            if (key <= last_bitmap_key) {
                roaring_bitmap_free(bitmap32);
                roaring64_bitmap_free(r);
                return NULL;
            }
            last_bitmap_key = key;
        }

        // Insert all containers of the 32-bit bitmap into the 64-bit bitmap.
        move_from_roaring32_offset(r, bitmap32, high32);
        roaring_bitmap_free(bitmap32);
    }
    return r;
}